

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O2

int cm_zlib_gzgetc(gzFile file)

{
  int iVar1;
  byte *pbVar2;
  uint uVar3;
  z_size_t zVar4;
  uchar buf [1];
  
  uVar3 = 0xffffffff;
  if (((file != (gzFile)0x0) && (file[1].have == 0x1c4f)) &&
     ((iVar1 = *(int *)((long)&file[4].pos + 4), iVar1 == 0 || (iVar1 == -5)))) {
    if (file->have != 0) {
      file->have = file->have - 1;
      file->pos = file->pos + 1;
      pbVar2 = file->next;
      file->next = pbVar2 + 1;
      return (int)*pbVar2;
    }
    zVar4 = gz_read((gz_statep)file,buf,1);
    uVar3 = -(uint)(zVar4 == 0) | (uint)buf[0];
  }
  return uVar3;
}

Assistant:

int ZEXPORT gzgetc(gzFile file) {
    unsigned char buf[1];
    gz_statep state;

    /* get internal structure */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;

    /* check that we're reading and that there's no (serious) error */
    if (state->mode != GZ_READ ||
        (state->err != Z_OK && state->err != Z_BUF_ERROR))
        return -1;

    /* try output buffer (no need to check for skip request) */
    if (state->x.have) {
        state->x.have--;
        state->x.pos++;
        return *(state->x.next)++;
    }

    /* nothing there -- try gz_read() */
    return gz_read(state, buf, 1) < 1 ? -1 : buf[0];
}